

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O2

void alf_one_blk_chroma(pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef
                       ,int sample_bit_depth)

{
  pel *ppVar1;
  pel *ppVar2;
  pel *ppVar3;
  pel *ppVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  pel *ppVar9;
  uint uVar10;
  pel *ppVar11;
  uint uVar12;
  pel pVar13;
  uint uVar14;
  uint uVar15;
  pel *ppVar16;
  uint uVar17;
  pel *ppVar18;
  pel *ppVar19;
  pel *local_a8;
  
  uVar10 = ~(-1 << ((byte)sample_bit_depth & 0x1f));
  iVar5 = lcu_height + -4;
  uVar6 = lcu_height - 1;
  uVar8 = lcu_height - 2;
  if (lcu_height < 1) {
    lcu_height = 0;
  }
  for (uVar12 = 0; uVar12 != lcu_height; uVar12 = uVar12 + 1) {
    ppVar1 = src + i_src;
    ppVar2 = src + -(long)i_src;
    ppVar3 = src + i_src * 2;
    ppVar4 = src + -(long)(i_src * 2);
    ppVar11 = src + i_src * 3;
    ppVar9 = ppVar3;
    ppVar16 = ppVar2;
    ppVar18 = ppVar4;
    ppVar19 = ppVar1;
    if (uVar12 < 3) {
      ppVar16 = src;
      ppVar18 = src;
      local_a8 = src;
      if ((uVar12 != 0) && (ppVar16 = ppVar2, ppVar18 = ppVar4, local_a8 = ppVar4, uVar12 == 1)) {
        ppVar18 = ppVar2;
        local_a8 = ppVar2;
      }
    }
    else {
      local_a8 = src + -(long)(i_src * 3);
      if (((iVar5 < (int)uVar12) && (ppVar9 = src, ppVar11 = src, ppVar19 = src, uVar12 != uVar6))
         && (ppVar9 = ppVar3, ppVar11 = ppVar3, ppVar19 = ppVar1, uVar12 == uVar8)) {
        ppVar9 = ppVar1;
        ppVar11 = ppVar1;
      }
    }
    for (lVar7 = 0; lVar7 < lcu_width * 2; lVar7 = lVar7 + 2) {
      uVar14 = (int)(((uint)src[lVar7 + -6] + (uint)src[lVar7 + 6]) * coef[10] +
                     ((uint)src[lVar7 + -4] + (uint)src[lVar7 + 4]) * coef[0xc] +
                     ((uint)src[lVar7 + -2] + (uint)src[lVar7 + 2]) * coef[0xe] +
                     ((uint)ppVar16[lVar7 + 2] + (uint)ppVar19[lVar7 + -2]) * coef[8] +
                     ((uint)ppVar16[lVar7] + (uint)ppVar19[lVar7]) * coef[6] +
                     ((uint)ppVar16[lVar7 + -2] + (uint)ppVar19[lVar7 + 2]) * coef[4] +
                     ((uint)ppVar18[lVar7] + (uint)ppVar9[lVar7]) * coef[2] +
                     ((uint)local_a8[lVar7] + (uint)ppVar11[lVar7]) * *coef +
                     (uint)src[lVar7] * coef[0x10] + 0x20) >> 6;
      uVar15 = uVar14;
      if ((int)uVar10 <= (int)uVar14) {
        uVar15 = uVar10;
      }
      uVar17 = (int)((uint)src[lVar7 + 1] * coef[0x11] +
                     ((uint)src[lVar7 + -5] + (uint)src[lVar7 + 7]) * coef[0xb] +
                     ((uint)src[lVar7 + -3] + (uint)src[lVar7 + 5]) * coef[0xd] +
                     ((uint)src[lVar7 + -1] + (uint)src[lVar7 + 3]) * coef[0xf] +
                     ((uint)ppVar16[lVar7 + 3] + (uint)ppVar19[lVar7 + -1]) * coef[9] +
                     ((uint)ppVar16[lVar7 + 1] + (uint)ppVar19[lVar7 + 1]) * coef[7] +
                     ((uint)ppVar16[lVar7 + -1] + (uint)ppVar19[lVar7 + 3]) * coef[5] +
                     ((uint)ppVar18[lVar7 + 1] + (uint)ppVar9[lVar7 + 1]) * coef[3] +
                     ((uint)local_a8[lVar7 + 1] + (uint)ppVar11[lVar7 + 1]) * coef[1] + 0x20) >> 6;
      pVar13 = (pel)uVar15;
      if ((int)uVar14 < 0) {
        pVar13 = '\0';
      }
      dst[lVar7] = pVar13;
      uVar15 = uVar17;
      if ((int)uVar10 <= (int)uVar17) {
        uVar15 = uVar10;
      }
      pVar13 = (pel)uVar15;
      if ((int)uVar17 < 0) {
        pVar13 = '\0';
      }
      dst[lVar7 + 1] = pVar13;
    }
    dst = dst + i_dst;
    src = ppVar1;
  }
  return;
}

Assistant:

static void alf_one_blk_chroma(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;

    int i, j;
    int startPos = 0;
    int endPos = lcu_height;
    int max_pel = (1 << sample_bit_depth) - 1;

    for (i = startPos; i < endPos; i++)
    {
        p1 = src + i_src;
        p2 = src - i_src;
        p3 = src + 2 * i_src;
        p4 = src - 2 * i_src;
        p5 = src + 3 * i_src;
        p6 = src - 3 * i_src;
        if (i < 3) {
            if (i == 0) {
                p4 = p2 = src;
            }
            else if (i == 1) {
                p4 = p2;
            }
            p6 = p4;
        }
        else if (i > lcu_height - 4) {
            if (i == lcu_height - 1) {
                p3 = p1 = src;
            }
            else if (i == lcu_height - 2) {
                p3 = p1;
            }
            p5 = p3;
        }

        for (j = 0; j < lcu_width << 1; j += 2)
        {
            int pixelIntU, pixelIntV;
            int xLeft = j - 2;
            int xRight = j + 2;

            pixelIntU  = coef[0 ] * (p5[j         ] + p6[j]);
            pixelIntV  = coef[1 ] * (p5[j + 1     ] + p6[j + 1]);
            pixelIntU += coef[2 ] * (p3[j         ] + p4[j]);
            pixelIntV += coef[3 ] * (p3[j + 1     ] + p4[j + 1]);
            pixelIntU += coef[4 ] * (p1[xRight    ] + p2[xLeft]);
            pixelIntV += coef[5 ] * (p1[xRight + 1] + p2[xLeft + 1]);
            pixelIntU += coef[6 ] * (p1[j         ] + p2[j]);
            pixelIntV += coef[7 ] * (p1[j + 1     ] + p2[j + 1]);
            pixelIntU += coef[8 ] * (p1[xLeft     ] + p2[xRight]);
            pixelIntV += coef[9 ] * (p1[xLeft + 1 ] + p2[xRight + 1]);
            pixelIntU += coef[14] * (src [xRight    ] + src [xLeft]);
            pixelIntV += coef[15] * (src [xRight + 1] + src [xLeft + 1]);

            xLeft  = j - 4;
            xRight = j + 4;
            pixelIntU += coef[12] * (src [xRight    ] + src [xLeft]);
            pixelIntV += coef[13] * (src [xRight + 1] + src [xLeft + 1]);

            xLeft  = j - 6;
            xRight = j + 6;
            pixelIntU += coef[10] * (src [xRight    ] + src [xLeft]);
            pixelIntV += coef[11] * (src [xRight + 1] + src [xLeft + 1]);

            pixelIntU += coef[16] * (src[j]);
            pixelIntV += coef[17] * (src[j + 1]);

            pixelIntU = (int)((pixelIntU + 32) >> 6);
            pixelIntV = (int)((pixelIntV + 32) >> 6);

            dst[j    ] = COM_CLIP3(0, max_pel, pixelIntU);
            dst[j + 1] = COM_CLIP3(0, max_pel, pixelIntV);

        }
        src += i_src;
        dst += i_dst;
    }
}